

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.h
# Opt level: O3

ReferencedPropertyRecordHashSet * __thiscall
Js::JavascriptLibrary::EnsureReferencedPropertyRecordList(JavascriptLibrary *this)

{
  Recycler *alloc;
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  this_00 = &((this->referencedPropertyRecords).ptr)->
             super_BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ;
  if (this_00 ==
      (BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    local_48 = (undefined1  [8])
               &JsUtil::
                BaseHashSet<Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2da4077;
    data.filename._0_4_ = 0x541;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
    this_00 = (BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x38,alloc,0x387914);
    JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,this->recycler,0xad);
    Memory::Recycler::WBSetBit((char *)&this->referencedPropertyRecords);
    (this->referencedPropertyRecords).ptr =
         (BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *)this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->referencedPropertyRecords);
  }
  return (ReferencedPropertyRecordHashSet *)this_00;
}

Assistant:

ReferencedPropertyRecordHashSet * EnsureReferencedPropertyRecordList()
        {
            ReferencedPropertyRecordHashSet* pidList = this->referencedPropertyRecords;
            if (pidList == nullptr)
            {
                pidList = RecyclerNew(this->recycler, ReferencedPropertyRecordHashSet, this->recycler, 173);
                this->referencedPropertyRecords = pidList;
            }
            return pidList;
        }